

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void SwapUVRow_C(uint8_t *src_uv,uint8_t *dst_vu,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  for (; (int)uVar2 != (int)uVar1; uVar1 = uVar1 + 1) {
    *(ushort *)(dst_vu + uVar1 * 2) =
         *(ushort *)(src_uv + uVar1 * 2) << 8 | *(ushort *)(src_uv + uVar1 * 2) >> 8;
  }
  return;
}

Assistant:

void SwapUVRow_C(const uint8_t* src_uv, uint8_t* dst_vu, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t u = src_uv[0];
    uint8_t v = src_uv[1];
    dst_vu[0] = v;
    dst_vu[1] = u;
    src_uv += 2;
    dst_vu += 2;
  }
}